

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mip_level::flip_y(mip_level *this)

{
  bool bVar1;
  mip_level *in_RDI;
  image<crnlib::color_quad<unsigned_char,_int>_> *unaff_retaddr;
  dxt_image *in_stack_00000018;
  bool local_1;
  
  bVar1 = is_valid(in_RDI);
  if (bVar1) {
    if (in_RDI->m_pDXTImage == (dxt_image *)0x0) {
      if (in_RDI->m_pImage == (image_u8 *)0x0) {
        local_1 = false;
      }
      else {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(unaff_retaddr);
        local_1 = true;
      }
    }
    else {
      local_1 = dxt_image::flip_y(in_stack_00000018);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool mip_level::flip_y() {
  if (!is_valid())
    return false;

  if (m_pDXTImage)
    return m_pDXTImage->flip_y();
  else if (m_pImage) {
    m_pImage->flip_y();
    return true;
  }

  return false;
}